

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-time.c
# Opt level: O2

int run_test_loop_update_time(void)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  uv_loop_t *loop;
  char *pcVar5;
  undefined8 uStack_20;
  
  uVar2 = uv_default_loop();
  lVar3 = uv_now(uVar2);
  do {
    uVar2 = uv_default_loop();
    lVar4 = uv_now(uVar2);
    loop = (uv_loop_t *)uv_default_loop();
    if (999 < (ulong)(lVar4 - lVar3)) {
      close_loop(loop);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      pcVar5 = "0 == uv_loop_close(uv_default_loop())";
      uStack_20 = 0x21;
      goto LAB_0013d89f;
    }
    iVar1 = uv_run(loop,2);
  } while (iVar1 == 0);
  pcVar5 = "0 == uv_run(uv_default_loop(), UV_RUN_NOWAIT)";
  uStack_20 = 0x1f;
LAB_0013d89f:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-time.c"
          ,uStack_20,pcVar5);
  abort();
}

Assistant:

TEST_IMPL(loop_update_time) {
  uint64_t start;

  start = uv_now(uv_default_loop());
  while (uv_now(uv_default_loop()) - start < 1000)
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_NOWAIT));

  MAKE_VALGRIND_HAPPY();
  return 0;
}